

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

int xmlSerializeDecCharRef(char *buf,int val)

{
  int local_28;
  int local_24;
  int i;
  int len;
  char *out;
  int val_local;
  char *buf_local;
  
  *buf = '&';
  buf[1] = '#';
  out._4_4_ = val;
  if (val < 100) {
    local_28 = 2;
    local_24 = local_28;
    if (val < 10) {
      local_28 = 1;
      local_24 = local_28;
    }
  }
  else if (val < 10000) {
    local_28 = 4;
    local_24 = local_28;
    if (val < 1000) {
      local_28 = 3;
      local_24 = local_28;
    }
  }
  else if (val < 1000000) {
    local_28 = 6;
    local_24 = local_28;
    if (val < 100000) {
      local_28 = 5;
      local_24 = local_28;
    }
  }
  else {
    local_24 = 7;
    local_28 = local_24;
  }
  while (local_28 = local_28 + -1, -1 < local_28) {
    buf[(long)local_28 + 2] = (char)(out._4_4_ % 10) + '0';
    out._4_4_ = out._4_4_ / 10;
  }
  buf[(long)local_24 + 2] = ';';
  return local_24 + 3;
}

Assistant:

int
xmlSerializeDecCharRef(char *buf, int val) {
    char *out = buf;
    int len, i;

    *out++ = '&';
    *out++ = '#';

    if (val < 100) {
        len = (val < 10) ? 1 : 2;
    } else if (val < 10000) {
        len = (val < 1000) ? 3 : 4;
    } else if (val < 1000000) {
        len = (val < 100000) ? 5 : 6;
    } else {
        len = 7;
    }

    for (i = len - 1; i >= 0; i--) {
        out[i] = '0' + val % 10;
        val /= 10;
    }

    out[len] = ';';

    return(len + 3);
}